

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiMessage.cpp
# Opt level: O0

void __thiscall smf::MidiMessage::makePitchBend(MidiMessage *this,int channel,int value)

{
  value_type local_23;
  value_type local_22;
  byte local_21;
  uint local_20;
  uint local_1c;
  int msb;
  int lsb;
  int value_local;
  int channel_local;
  MidiMessage *this_local;
  
  msb = value;
  lsb = channel;
  _value_local = this;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,0);
  local_1c = msb & 0x7f;
  local_20 = msb >> 7 & 0x7f;
  local_21 = (byte)lsb & 0x7f | 0xe0;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_21);
  local_22 = (value_type)local_1c;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_22);
  local_23 = (value_type)local_20;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
            (&this->super_vector<unsigned_char,_std::allocator<unsigned_char>_>,&local_23);
  return;
}

Assistant:

void MidiMessage::makePitchBend(int channel, int value) {
	resize(0);
	int lsb = value & 0x7f;
	int msb = (value >> 7) & 0x7f;
	push_back(0xe0 | (0x7f & channel));
	push_back(lsb);
	push_back(msb);
}